

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O3

void __thiscall
phosg::Subprocess::Subprocess
          (Subprocess *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmd,int stdin_fd,int stdout_fd,int stderr_fd,string *cwd,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *env)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  int iVar3;
  __pid_t _Var4;
  int extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  _Rb_tree_node_base *p_Var5;
  runtime_error *this_00;
  uint *puVar6;
  int error;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  long *plVar7;
  Subprocess *this_01;
  string *s;
  pointer pbVar8;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<const_char_*,_std::allocator<const_char_*>_> envp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  environ;
  set<int,_std::less<int>,_std::allocator<int>_> parent_fds_to_close;
  int local_e4;
  int local_e0;
  int local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  char **local_98;
  undefined8 uStack_90;
  long local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  this->stdin_write_fd = -1;
  this->stdout_read_fd = -1;
  this->stderr_read_fd = -1;
  this->child_pid = 0;
  this->exit_status = -1;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = this;
  local_e4 = stderr_fd;
  local_e0 = stdout_fd;
  local_dc = stdin_fd;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (stdin_fd == -1) {
    local_dc = pipe(&this->stdin_write_fd);
    this->stdin_write_fd = extraout_var;
    this_01 = (Subprocess *)&local_60;
    ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_emplace_unique<int&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_01,
               &local_dc);
  }
  if (local_e0 == -1) {
    iVar3 = pipe(&this_01->stdin_write_fd);
    this->stdout_read_fd = iVar3;
    this_01 = (Subprocess *)&local_60;
    local_e0 = extraout_var_00;
    ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_emplace_unique<int&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_01,
               &local_e0);
  }
  if (local_e4 == -1) {
    iVar3 = pipe(&this_01->stdin_write_fd);
    this->stderr_read_fd = iVar3;
    local_e4 = extraout_var_01;
    ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_emplace_unique<int&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,&local_e4);
  }
  _Var4 = fork();
  this->child_pid = _Var4;
  if (_Var4 != 0) {
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (_Var4 != -1) {
      for (; (_Rb_tree_header *)p_Var5 != p_Var1;
          p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5)) {
        close(p_Var5[1]._M_color);
      }
      ::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      ~_Rb_tree(&local_60);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar6 = (uint *)__errno_location();
    string_for_error_abi_cxx11_(&local_b8,(phosg *)(ulong)*puVar6,error);
    ::std::operator+(&local_d8,"fork failed: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8)
    ;
    ::std::runtime_error::runtime_error(this_00,(string *)&local_d8);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  replace_fd(local_dc,0);
  replace_fd(local_e0,1);
  replace_fd(local_e4,2);
  close(this->stdin_write_fd);
  close(this->stdout_read_fd);
  close(this->stderr_read_fd);
  if (cwd != (string *)0x0) {
    chdir((cwd->_M_dataplus)._M_p);
  }
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  pbVar8 = (cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar2) {
    do {
      local_d8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      ::std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_b8,(char **)&local_d8);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar2);
  }
  local_d8._M_dataplus._M_p = (pointer)0x0;
  ::std::vector<char_const*,std::allocator<char_const*>>::emplace_back<decltype(nullptr)>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_b8,(void **)&local_d8);
  if (env == (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0) {
    execvp((((cmd->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
           (char **)local_b8._M_dataplus._M_p);
  }
  else {
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88 = 0;
    local_98 = (char **)0x0;
    uStack_90 = 0;
    plVar7 = *(long **)(env + 0x10);
    if (plVar7 != (long *)0x0) {
      do {
        string_printf_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   "%s=%s",plVar7[1],plVar7[5]);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        local_d8._M_dataplus._M_p =
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
        ::std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_98,(char **)&local_d8);
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
    }
    local_d8._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<char_const*,std::allocator<char_const*>>::emplace_back<decltype(nullptr)>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_98,(void **)&local_d8);
    execve((((cmd->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
           (char **)local_b8._M_dataplus._M_p,local_98);
    if (local_98 != (char **)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  _exit(1);
}

Assistant:

Subprocess::Subprocess(const vector<string>& cmd, int stdin_fd, int stdout_fd,
    int stderr_fd, const string* cwd, const unordered_map<string, string>* env)
    : stdin_write_fd(-1),
      stdout_read_fd(-1),
      stderr_read_fd(-1),
      child_pid(0),
      exit_status(-1) {

  set<int> parent_fds_to_close;

  if (stdin_fd == -1) {
    auto pipefds = pipe();
    stdin_fd = pipefds.first;
    this->stdin_write_fd = pipefds.second;
    parent_fds_to_close.emplace(stdin_fd);
  }
  if (stdout_fd == -1) {
    auto pipefds = pipe();
    this->stdout_read_fd = pipefds.first;
    stdout_fd = pipefds.second;
    parent_fds_to_close.emplace(stdout_fd);
  }
  if (stderr_fd == -1) {
    auto pipefds = pipe();
    this->stderr_read_fd = pipefds.first;
    stderr_fd = pipefds.second;
    parent_fds_to_close.emplace(stderr_fd);
  }

  this->child_pid = fork();
  if (this->child_pid == -1) {
    throw runtime_error("fork failed: " + string_for_error(errno));
  }
  if (this->child_pid == 0) {
    // in child process
    replace_fd(stdin_fd, 0);
    replace_fd(stdout_fd, 1);
    replace_fd(stderr_fd, 2);
    close(this->stdin_write_fd);
    close(this->stdout_read_fd);
    close(this->stderr_read_fd);

    if (cwd) {
      chdir(cwd->c_str());
    }

    // make the argv list. this is ugly but it will be blown away by execve
    vector<const char*> argv;
    for (const string& s : cmd) {
      argv.emplace_back(s.c_str());
    }
    argv.emplace_back(nullptr);

    if (env) {
      vector<string> environ;
      vector<const char*> envp;
      for (const auto& it : *env) {
        environ.emplace_back(string_printf("%s=%s", it.first.c_str(), it.second.c_str()));
        envp.emplace_back(environ.back().c_str());
      }
      envp.emplace_back(nullptr);
      execve(cmd[0].c_str(), (char* const*)argv.data(), (char* const*)envp.data());

    } else {
      execvp(cmd[0].c_str(), (char* const*)argv.data());
    }
    // if we get here, fork() worked, but execv_() failed: exit child process without even doing cleanup
    _exit(1);
  }

  for (int fd : parent_fds_to_close) {
    close(fd);
  }
}